

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<double> __thiscall
Omega_h::coalesce<double>
          (Omega_h *this,
          vector<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *arrays)

{
  LO size_in;
  value_type vVar1;
  pointer pRVar2;
  ulong *puVar3;
  ulong uVar4;
  void *in_RDX;
  pointer pRVar5;
  void *extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Read<double> RVar9;
  Write<double> out;
  Write<signed_char> local_90;
  value_type array;
  type f;
  vector<int,_std::allocator<int>_> offsets;
  
  pRVar5 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 == pRVar2) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector
              (&offsets,((long)pRVar2 - (long)pRVar5 >> 4) + 1,(allocator_type *)&f);
    if (offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      fail("assertion %s failed at %s +%d\n","offsets.data() != nullptr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x1c2);
    }
    *offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
    pRVar5 = (arrays->
             super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(arrays->
                  super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 4;
    for (uVar6 = 1; pRVar5 = pRVar5 + 1, uVar6 <= uVar4; uVar6 = uVar6 + 1) {
      puVar3 = &((pRVar5->write_).shared_alloc_.alloc)->size;
      if (((ulong)puVar3 & 1) == 0) {
        uVar7 = *puVar3;
      }
      else {
        uVar7 = (ulong)puVar3 >> 3;
      }
      offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar6] = (int)(uVar7 >> 3) +
                offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6 - 1];
    }
    size_in = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4];
    std::__cxx11::string::string((string *)&f,"",(allocator *)&array);
    Write<double>::Write(&out,size_in,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    lVar8 = 0;
    for (uVar6 = 0;
        pRVar5 = (arrays->
                 super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(arrays->
                              super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 4);
        uVar6 = uVar6 + 1) {
      Write<double>::Write
                ((Write<double> *)&array,
                 (Write<double> *)((long)&(pRVar5->write_).shared_alloc_.alloc + lVar8));
      vVar1 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar6];
      Write<double>::Write((Write<double> *)&f,&out);
      f.offset = vVar1;
      Write<double>::Write((Write<double> *)&f.array,(Write<double> *)&array);
      if (((ulong)array.write_.shared_alloc_.alloc & 1) == 0) {
        uVar4 = (array.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar4 = (ulong)array.write_.shared_alloc_.alloc >> 3;
      }
      parallel_for<Omega_h::coalesce<double>(std::vector<Omega_h::Read<double>,std::allocator<Omega_h::Read<double>>>)::_lambda(int)_1_>
                ((LO)(uVar4 >> 3),&f,"coalesce");
      coalesce<double>(std::vector<Omega_h::Read<double>,std::allocator<Omega_h::Read<double>>>)::
      {lambda(int)#1}::~vector((_lambda_int__1_ *)&f);
      Write<double>::~Write((Write<double> *)&array);
      lVar8 = lVar8 + 0x10;
    }
    Write<double>::Write(&local_90,(Write<signed_char> *)&out);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_90);
    Write<double>::~Write((Write<double> *)&local_90);
    Write<double>::~Write(&out);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&offsets.super__Vector_base<int,_std::allocator<int>_>);
    in_RDX = extraout_RDX;
  }
  RVar9.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<T> coalesce(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  std::vector<LO> offsets(arrays.size() + 1);
  OMEGA_H_CHECK(offsets.data() != nullptr);
  offsets[0] = 0;
  for (std::size_t i = 1; i <= arrays.size(); ++i) {
    offsets[i] = offsets[i - 1] + arrays[i].size();
  }
  auto out_size = offsets[arrays.size()];
  auto out = Write<T>(out_size);
  for (std::size_t i = 0; i < arrays.size(); ++i) {
    auto array = arrays[std::size_t(i)];
    auto offset = offsets[i];
    auto f = OMEGA_H_LAMBDA(LO j) { out[offset + j] = array[j]; };
    parallel_for(array.size(), f, "coalesce");
  }
  return out;
}